

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O2

bool __thiscall
AutoArgParse::FlagStore::tryParseArg
          (FlagStore *this,ArgIter *first,ArgIter *last,Policy *foundArgPolicy)

{
  pointer puVar1;
  ArgBase *pAVar2;
  pointer puVar3;
  
  puVar3 = (this->args).
           super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->args).
           super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar3 == puVar1) {
LAB_00107950:
      return puVar3 != puVar1;
    }
    pAVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
             .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
    if ((pAVar2->super_ParseToken)._parsed == false) {
      (**(code **)((long)(pAVar2->super_ParseToken)._vptr_ParseToken + 0x10))(pAVar2,first,last);
      pAVar2 = (puVar3->_M_t).
               super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
               .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
      if ((pAVar2->super_ParseToken)._parsed == true) {
        *foundArgPolicy = (pAVar2->super_ParseToken).policy;
        goto LAB_00107950;
      }
    }
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

AUTOARGPARSE_INLINE bool FlagStore::tryParseArg(ArgIter& first, ArgIter& last,
                                                Policy& foundArgPolicy) {
    for (auto& argPtr : args) {
        if (argPtr->parsed()) {
            continue;
        }
        argPtr->parse(first, last);
        if (argPtr->parsed()) {
            foundArgPolicy = argPtr->policy;
            return true;
        }
    }
    return false;
}